

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview_p.h
# Opt level: O0

SelectionFlags __thiscall
QAbstractItemViewPrivate::selectionBehaviorFlags(QAbstractItemViewPrivate *this)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  long in_FS_OFFSET;
  SelectionFlag in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(in_RDI + 0x33c);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)CONCAT44(1,in_stack_ffffffffffffffe0)
                 ,in_stack_ffffffffffffffdc);
      goto LAB_00817576;
    }
    if (iVar1 == 2) {
      QFlags<QItemSelectionModel::SelectionFlag>::QFlags
                ((QFlags<QItemSelectionModel::SelectionFlag> *)CONCAT44(2,in_stack_ffffffffffffffe0)
                 ,in_stack_ffffffffffffffdc);
      goto LAB_00817576;
    }
  }
  QFlags<QItemSelectionModel::SelectionFlag>::QFlags
            ((QFlags<QItemSelectionModel::SelectionFlag> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0)
             ,in_stack_ffffffffffffffdc);
LAB_00817576:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
         local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
}

Assistant:

inline QItemSelectionModel::SelectionFlags selectionBehaviorFlags() const
    {
        switch (selectionBehavior) {
        case QAbstractItemView::SelectRows: return QItemSelectionModel::Rows;
        case QAbstractItemView::SelectColumns: return QItemSelectionModel::Columns;
        case QAbstractItemView::SelectItems: default: return QItemSelectionModel::NoUpdate;
        }
    }